

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void vkt::sr::anon_unknown_0::eval_modScalarVec_uvec2(ShaderEvalContext *c)

{
  float fVar1;
  ulong uVar2;
  int i;
  long lVar3;
  int i_1;
  Vector<unsigned_int,_2> res;
  Vector<unsigned_int,_2> res_1;
  Vector<float,_2> res_2;
  Vec4 *local_18;
  int local_10 [2];
  ulong local_8;
  
  uVar2 = *(ulong *)c->in[1].m_data;
  fVar1 = c->in[0].m_data[2];
  local_8 = uVar2 << 0x20 | uVar2 >> 0x20;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = (uint)(long)*(float *)((long)&local_8 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  lVar3 = 0;
  do {
    *(int *)((long)&local_18 + lVar3 * 4) = (int)(long)fVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3] = *(uint *)((long)&local_18 + lVar3 * 4) % res.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    res_2.m_data[lVar3] = (float)res_1.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_18 = &c->color;
  local_10[0] = 1;
  local_10[1] = 2;
  lVar3 = 0;
  do {
    (c->color).m_data[local_10[lVar3]] = res_2.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }